

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

void __thiscall
QCompleterPrivate::_q_completionSelected(QCompleterPrivate *this,QItemSelection *selection)

{
  QModelIndex index;
  quintptr qVar1;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar2;
  long in_FS_OFFSET;
  undefined8 local_68;
  QArrayDataPointer<QModelIndex> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::indexes();
  if ((undefined1 *)local_38.size == (undefined1 *)0x0) {
    local_68 = 0xffffffffffffffff;
    qVar1 = 0;
    tVar2.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    local_68._0_4_ = (local_38.ptr)->r;
    local_68._4_4_ = (local_38.ptr)->c;
    qVar1 = (local_38.ptr)->i;
    tVar2.ptr = ((local_38.ptr)->m).ptr;
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_38);
  index.i = qVar1;
  index.r = (undefined4)local_68;
  index.c = local_68._4_4_;
  index.m.ptr = tVar2.ptr;
  _q_complete(this,index,true);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompleterPrivate::_q_completionSelected(const QItemSelection& selection)
{
    QModelIndex index;
    if (const auto indexes = selection.indexes(); !indexes.isEmpty())
        index = indexes.first();

    _q_complete(index, true);
}